

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

void __thiscall
QVLABase<QPushButton_*>::append_impl
          (QVLABase<QPushButton_*> *this,qsizetype prealloc,void *array,QPushButton **abuf,
          qsizetype increment)

{
  long lVar1;
  long asize;
  long aalloc;
  
  if (0 < increment) {
    asize = (this->super_QVLABaseBase).s;
    lVar1 = asize + increment;
    if ((this->super_QVLABaseBase).a <= lVar1) {
      aalloc = asize * 2;
      if (asize * 2 <= lVar1) {
        aalloc = lVar1;
      }
      reallocate_impl(this,prealloc,array,asize,aalloc);
      asize = (this->super_QVLABaseBase).s;
    }
    memcpy((void *)(asize * 8 + (long)(this->super_QVLABaseBase).ptr),abuf,increment << 3);
    (this->super_QVLABaseBase).s = lVar1;
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::append_impl(qsizetype prealloc, void *array, const T *abuf, qsizetype increment)
{
    Q_ASSERT(abuf || increment == 0);
    if (increment <= 0)
        return;

    const qsizetype asize = size() + increment;

    if (asize >= capacity())
        growBy(prealloc, array, increment);

    if constexpr (QTypeInfo<T>::isComplex)
        std::uninitialized_copy_n(abuf, increment, end());
    else
        memcpy(static_cast<void *>(end()), static_cast<const void *>(abuf), increment * sizeof(T));

    this->s = asize;
}